

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester_list.c
# Opt level: O3

void tester_list_print_log(tester_list_t *list)

{
  tester_list *ptVar1;
  tester_t *ptVar2;
  
  for (ptVar1 = list->next; ptVar1 != (tester_list *)0x0; ptVar1 = ptVar1->next) {
    ptVar2 = ptVar1->this;
    if (ptVar2 != (tester_t *)0x0) {
      printf("PID: %d\nRcd: %zu\nAcc: %zu\n",(ulong)(uint)ptVar2->pid,ptVar2->rcd,ptVar2->acc);
    }
  }
  return;
}

Assistant:

void tester_list_print_log(const tester_list_t *list) {
    TESTER_LIST_ASSERT_OK;

    tester_list_t *iter = list->next;
    while(iter != NULL) {
        if(iter->this != NULL) {
            printf("PID: %d\nRcd: %zu\nAcc: %zu\n", iter->this->pid, iter->this->rcd, iter->this->acc);
        }
        iter = iter->next;
    }
}